

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_6b65cb::HandleCompareCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  __type _Var4;
  char *pcVar5;
  string *this;
  cmMakefile *this_00;
  string_view value;
  string e;
  string e_1;
  cmAlphaNum local_60;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"sub-command COMPARE requires a mode to be specified.",
               (allocator<char> *)&local_60);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    __lhs = pbVar1 + 1;
    bVar3 = std::operator==(__lhs,"EQUAL");
    if ((((bVar3) || (bVar3 = std::operator==(__lhs,"NOTEQUAL"), bVar3)) ||
        (bVar3 = std::operator==(__lhs,"LESS"), bVar3)) ||
       (((bVar3 = std::operator==(__lhs,"LESS_EQUAL"), bVar3 ||
         (bVar3 = std::operator==(__lhs,"GREATER"), bVar3)) ||
        (bVar3 = std::operator==(__lhs,"GREATER_EQUAL"), bVar3)))) {
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
        e._M_dataplus._M_p = &DAT_0000001a;
        e._M_string_length = (size_type)anon_var_dwarf_6b63fd;
        local_60.View_._M_str = pbVar1[1]._M_dataplus._M_p;
        local_60.View_._M_len = pbVar1[1]._M_string_length;
        cmStrCat<char[46]>(&e_1,(cmAlphaNum *)&e,&local_60,(char (*) [46])0x581dd6);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        this = &e_1;
        goto LAB_00202f70;
      }
      __lhs_00 = pbVar2 + 2;
      __rhs = pbVar2 + 3;
      bVar3 = std::operator==(__lhs,"LESS");
      if (bVar3) {
        bVar3 = std::operator<(__lhs_00,__rhs);
LAB_00203006:
        if (bVar3 != false) {
LAB_0020300a:
          this_00 = status->Makefile;
          pcVar5 = "1";
          goto LAB_00203041;
        }
      }
      else {
        bVar3 = std::operator==(__lhs,"LESS_EQUAL");
        if (bVar3) {
          bVar3 = std::operator<=(__lhs_00,__rhs);
          goto LAB_00203006;
        }
        bVar3 = std::operator==(__lhs,"GREATER");
        if (bVar3) {
          bVar3 = std::operator>(__lhs_00,__rhs);
          goto LAB_00203006;
        }
        bVar3 = std::operator==(__lhs,"GREATER_EQUAL");
        if (bVar3) {
          bVar3 = std::operator>=(__lhs_00,__rhs);
          goto LAB_00203006;
        }
        bVar3 = std::operator==(__lhs,"EQUAL");
        _Var4 = std::operator==(__lhs_00,__rhs);
        if (bVar3 == _Var4) goto LAB_0020300a;
      }
      this_00 = status->Makefile;
      pcVar5 = "0";
LAB_00203041:
      value._M_str = pcVar5;
      value._M_len = 1;
      cmMakefile::AddDefinition(this_00,pbVar2 + 4,value);
      return true;
    }
    std::operator+(&e,"sub-command COMPARE does not recognize mode ",__lhs);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  this = &e;
LAB_00202f70:
  std::__cxx11::string::~string((string *)this);
  return false;
}

Assistant:

bool HandleCompareCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if ((mode == "EQUAL") || (mode == "NOTEQUAL") || (mode == "LESS") ||
      (mode == "LESS_EQUAL") || (mode == "GREATER") ||
      (mode == "GREATER_EQUAL")) {
    if (args.size() < 5) {
      std::string e =
        cmStrCat("sub-command COMPARE, mode ", mode,
                 " needs at least 5 arguments total to command.");
      status.SetError(e);
      return false;
    }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if (mode == "LESS") {
      result = (left < right);
    } else if (mode == "LESS_EQUAL") {
      result = (left <= right);
    } else if (mode == "GREATER") {
      result = (left > right);
    } else if (mode == "GREATER_EQUAL") {
      result = (left >= right);
    } else if (mode == "EQUAL") {
      result = (left == right);
    } else // if(mode == "NOTEQUAL")
    {
      result = !(left == right);
    }
    if (result) {
      status.GetMakefile().AddDefinition(outvar, "1");
    } else {
      status.GetMakefile().AddDefinition(outvar, "0");
    }
    return true;
  }
  std::string e = "sub-command COMPARE does not recognize mode " + mode;
  status.SetError(e);
  return false;
}